

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O0

extent_t *
extent_alloc_retained
          (tsdn_t *tsdn,arena_t *arena,extent_hooks_t **r_extent_hooks,void *new_addr,size_t size,
          size_t pad,size_t alignment,_Bool slab,szind_t szind,_Bool *zero,_Bool *commit)

{
  long in_RCX;
  tsdn_t *in_R9;
  byte in_stack_00000010;
  undefined4 in_stack_00000018;
  extent_t *extent;
  _Bool in_stack_00000176;
  _Bool in_stack_00000177;
  size_t in_stack_00000178;
  void *in_stack_00000180;
  extents_t *in_stack_00000188;
  extent_hooks_t **in_stack_00000190;
  arena_t *in_stack_00000198;
  tsdn_t *in_stack_000001a0;
  size_t in_stack_00000270;
  size_t in_stack_00000278;
  szind_t in_stack_00000288;
  _Bool *in_stack_00000290;
  _Bool *in_stack_00000298;
  undefined1 in_stack_0000039f;
  size_t in_stack_000003a0;
  size_t in_stack_000003a8;
  size_t in_stack_000003b0;
  extent_hooks_t **in_stack_000003b8;
  arena_t *in_stack_000003c0;
  tsdn_t *in_stack_000003c8;
  szind_t in_stack_000004e8;
  _Bool *in_stack_000004f0;
  _Bool *in_stack_000004f8;
  undefined8 in_stack_ffffffffffffff78;
  undefined4 uVar1;
  malloc_mutex_t *mutex;
  malloc_mutex_t *in_stack_ffffffffffffff80;
  tsdn_t *tsdn_00;
  tsdn_t *in_stack_ffffffffffffff88;
  undefined8 local_58;
  
  uVar1 = (undefined4)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  malloc_mutex_lock(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  mutex = (malloc_mutex_t *)CONCAT44(uVar1,(uint)(in_stack_00000010 & 1));
  tsdn_00 = (tsdn_t *)CONCAT44((int)((ulong)in_stack_ffffffffffffff80 >> 0x20),in_stack_00000018);
  local_58 = extent_recycle(in_stack_000001a0,in_stack_00000198,in_stack_00000190,in_stack_00000188,
                            in_stack_00000180,in_stack_00000178,in_stack_00000270,in_stack_00000278,
                            in_stack_00000177,in_stack_00000288,in_stack_00000290,in_stack_00000298,
                            in_stack_00000176);
  if (local_58 == (extent_t *)0x0) {
    if (((opt_retain & 1U) == 0) || (in_RCX != 0)) {
      malloc_mutex_unlock(tsdn_00,mutex);
    }
    else {
      in_R9 = (tsdn_t *)CONCAT44((int)((ulong)in_R9 >> 0x20),(uint)(in_stack_00000010 & 1));
      local_58 = extent_grow_retained
                           (in_stack_000003c8,in_stack_000003c0,in_stack_000003b8,in_stack_000003b0,
                            in_stack_000003a8,in_stack_000003a0,(_Bool)in_stack_0000039f,
                            in_stack_000004e8,in_stack_000004f0,in_stack_000004f8);
    }
  }
  else {
    malloc_mutex_unlock(tsdn_00,mutex);
  }
  malloc_mutex_assert_not_owner(in_R9,(malloc_mutex_t *)0x166b7a);
  return local_58;
}

Assistant:

static extent_t *
extent_alloc_retained(tsdn_t *tsdn, arena_t *arena,
    extent_hooks_t **r_extent_hooks, void *new_addr, size_t size, size_t pad,
    size_t alignment, bool slab, szind_t szind, bool *zero, bool *commit) {
	assert(size != 0);
	assert(alignment != 0);

	malloc_mutex_lock(tsdn, &arena->extent_grow_mtx);

	extent_t *extent = extent_recycle(tsdn, arena, r_extent_hooks,
	    &arena->extents_retained, new_addr, size, pad, alignment, slab,
	    szind, zero, commit, true);
	if (extent != NULL) {
		malloc_mutex_unlock(tsdn, &arena->extent_grow_mtx);
		if (config_prof) {
			extent_gdump_add(tsdn, extent);
		}
	} else if (opt_retain && new_addr == NULL) {
		extent = extent_grow_retained(tsdn, arena, r_extent_hooks, size,
		    pad, alignment, slab, szind, zero, commit);
		/* extent_grow_retained() always releases extent_grow_mtx. */
	} else {
		malloc_mutex_unlock(tsdn, &arena->extent_grow_mtx);
	}
	malloc_mutex_assert_not_owner(tsdn, &arena->extent_grow_mtx);

	return extent;
}